

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreParsingUtils.h
# Opt level: O1

bool Assimp::Ogre::EndsWith(string *s,string *suffix,bool caseSensitive)

{
  ulong uVar1;
  char *__s2;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  uint *puVar5;
  int iVar6;
  size_type sVar7;
  ulong uVar8;
  bool bVar9;
  string sSuffix;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  uint *local_b0;
  ulong local_a8;
  uint local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  uint *local_90;
  ulong local_88;
  undefined8 local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  string local_70;
  string local_50;
  
  uVar1 = s->_M_string_length;
  if ((uVar1 == 0) || (uVar1 <= suffix->_M_string_length - 1)) {
    bVar9 = false;
  }
  else {
    if (caseSensitive) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)s);
      if ((int)suffix->_M_string_length == (int)local_70._M_string_length) {
        if ((uint *)local_70._M_dataplus._M_p == (uint *)0x0) {
          __assert_fail("__null != s1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/StringComparison.h"
                        ,0x8f,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
        }
        __s2 = (suffix->_M_dataplus)._M_p;
        if (__s2 == (char *)0x0) {
          __assert_fail("__null != s2",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/StringComparison.h"
                        ,0x90,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
        }
        iVar6 = strcasecmp(local_70._M_dataplus._M_p,__s2);
        bVar9 = iVar6 == 0;
      }
      else {
        bVar9 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        return bVar9;
      }
    }
    else {
      pcVar2 = (s->_M_dataplus)._M_p;
      local_b0 = &local_a0;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b0,pcVar2,pcVar2 + uVar1);
      uVar1 = local_a8;
      puVar5 = local_b0;
      if (local_a8 != 0) {
        uVar8 = 0;
        do {
          iVar6 = tolower((int)*(char *)((long)puVar5 + uVar8));
          *(char *)((long)puVar5 + uVar8) = (char)iVar6;
          uVar8 = uVar8 + 1;
        } while (uVar1 != uVar8);
      }
      if (local_b0 == &local_a0) {
        uStack_78 = uStack_98;
        uStack_74 = uStack_94;
        local_90 = (uint *)&local_80;
      }
      else {
        local_90 = local_b0;
      }
      local_80 = CONCAT44(uStack_9c,local_a0);
      local_88 = local_a8;
      local_a8 = 0;
      local_a0 = local_a0 & 0xffffff00;
      pcVar2 = (suffix->_M_dataplus)._M_p;
      local_d0 = &local_c0;
      local_b0 = &local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar2,pcVar2 + suffix->_M_string_length);
      sVar4 = local_c8;
      paVar3 = local_d0;
      if (local_c8 != 0) {
        sVar7 = 0;
        do {
          iVar6 = tolower((int)paVar3->_M_local_buf[sVar7]);
          paVar3->_M_local_buf[sVar7] = (char)iVar6;
          sVar7 = sVar7 + 1;
        } while (sVar4 != sVar7);
      }
      sVar4 = local_c8;
      if (local_d0 == &local_c0) {
        local_50.field_2._8_8_ = local_c0._8_8_;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      }
      else {
        local_50._M_dataplus._M_p = (pointer)local_d0;
      }
      local_50.field_2._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
      local_50.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
      local_50._M_string_length = local_c8;
      local_c8 = 0;
      local_c0._M_local_buf[0] = '\0';
      if (sVar4 - 1 < local_88 && local_88 != 0) {
        local_d0 = &local_c0;
        std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_90);
        iVar6 = ASSIMP_stricmp(&local_70,&local_50);
        bVar9 = iVar6 == 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar9 = false;
        local_d0 = &local_c0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,CONCAT71(local_c0._M_allocated_capacity._1_7_,
                                          local_c0._M_local_buf[0]) + 1);
      }
      if (local_90 != (uint *)&local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_b0 == &local_a0) {
        return bVar9;
      }
      local_70.field_2._M_allocated_capacity = CONCAT44(uStack_9c,local_a0);
      local_70._M_dataplus._M_p = (pointer)local_b0;
    }
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return bVar9;
}

Assistant:

static AI_FORCE_INLINE
bool EndsWith(const std::string &s, const std::string &suffix, bool caseSensitive = true) {
    if (s.empty() || suffix.empty()) {
        return false;
    } else if (s.length() < suffix.length()) {
        return false;
    }

    if (!caseSensitive) {
        return EndsWith(ToLower(s), ToLower(suffix), true);
    }

    size_t len = suffix.length();
    std::string sSuffix = s.substr(s.length()-len, len);

    return (ASSIMP_stricmp(sSuffix, suffix) == 0);
}